

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_expr.cpp
# Opt level: O1

any * __thiscall Omega_h::VarOp::eval(any *__return_storage_ptr__,VarOp *this,ExprEnv *env)

{
  iterator iVar1;
  ostream *poVar2;
  ParserFail *this_00;
  stringstream ss;
  string sStack_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any>_>_>
                  *)env,&this->name);
  if ((_Rb_tree_header *)iVar1._M_node != &(env->variables)._M_t._M_impl.super__Rb_tree_header) {
    __return_storage_ptr__->vtable = (vtable_type *)iVar1._M_node[2]._M_left;
    if (iVar1._M_node[2]._M_left != (_Base_ptr)0x0) {
      (*(code *)(iVar1._M_node[2]._M_left)->_M_left)(iVar1._M_node + 2,__return_storage_ptr__);
    }
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"unknown variable name \"",0x17);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_198,(this->name)._M_dataplus._M_p,(this->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"\n",2);
  this_00 = (ParserFail *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  ParserFail::ParserFail(this_00,&sStack_1c8);
  __cxa_throw(this_00,&ParserFail::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

any VarOp::eval(ExprEnv& env) {
  auto it = env.variables.find(name);
  if (it == env.variables.end()) {
    std::stringstream ss;
    ss << "unknown variable name \"" << name << "\"\n";
    throw ParserFail(ss.str());
  }
  return it->second;
}